

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::logic_t_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<(anonymous_namespace)::logic_t_const&> *this,logic_t *rhs)

{
  int iVar1;
  int iVar2;
  logic_t *value;
  ostream *poVar3;
  ostringstream os;
  ulong *local_290;
  ulong local_280;
  undefined8 uStack_278;
  char *local_270;
  long local_268;
  char local_260 [8];
  undefined8 uStack_258;
  char *local_250;
  long local_248;
  char local_240 [8];
  undefined8 uStack_238;
  string local_230;
  ulong *local_210;
  size_type local_208;
  ulong local_200;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  bool local_1f0;
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8 [16];
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  value = *(logic_t **)this;
  iVar1 = rhs->value;
  iVar2 = value->value;
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"==","");
  local_270 = local_260;
  if (local_250 == local_240) {
    uStack_258 = uStack_238;
  }
  else {
    local_270 = local_250;
  }
  local_268 = local_248;
  local_248 = 0;
  local_240[0] = '\0';
  local_250 = local_240;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  to_string<(anonymous_namespace)::logic_t>(&local_230,value);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_270,local_268);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  to_string<(anonymous_namespace)::logic_t>(&local_1c8,rhs);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p == &local_230.field_2) {
    uStack_278 = local_230.field_2._8_8_;
    local_290 = &local_280;
  }
  else {
    local_290 = (ulong *)local_230._M_dataplus._M_p;
  }
  local_280 = local_230.field_2._M_allocated_capacity;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_290 == &local_280) {
    uStack_1f8 = (undefined4)uStack_278;
    uStack_1f4 = uStack_278._4_4_;
    local_210 = &local_200;
  }
  else {
    local_210 = local_290;
  }
  local_1f0 = iVar2 == iVar1;
  local_208 = local_230._M_string_length;
  local_280 = local_280 & 0xffffffffffffff00;
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_210,(long)local_210 + local_230._M_string_length);
  __return_storage_ptr__->passed = local_1f0;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_1e8,local_1e8 + local_1e0);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }